

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O2

void __thiscall absl::AlphaNum::AlphaNum(AlphaNum *this,Dec dec)

{
  byte bVar1;
  ulong uVar2;
  size_type sVar3;
  size_t __n;
  char *__s;
  
  uVar2 = dec.value;
  (this->piece_).ptr_ = (char *)0x0;
  (this->piece_).length_ = 0;
  if (dec.width < 0x21) {
    __s = this->digits_ + 0x1f;
    for (; 9 < uVar2; uVar2 = uVar2 / 10) {
      *__s = (byte)(uVar2 % 10) | 0x30;
      __s = __s + -1;
    }
    *__s = (byte)uVar2 | 0x30;
    if ((dec._8_4_ >> 0x10 & 1) != 0) {
      __s[-1] = 0x2d;
      __s = __s + -1;
    }
    __n = (long)__s - ((long)this + (0x30 - (ulong)(dec._8_4_ & 0x3f)));
    if (0 < (long)__n) {
      bVar1 = dec.fill == '0' & dec.neg;
      __s = __s + (bVar1 - __n);
      memset(__s,dec._9_4_ & 0xff,__n);
      if (bVar1 == 1) {
        __s[-1] = 0x2d;
        __s = __s + -1;
      }
    }
    sVar3 = string_view::CheckLengthInternal((long)this + (0x30 - (long)__s));
    (this->piece_).ptr_ = __s;
    (this->piece_).length_ = sVar3;
    return;
  }
  __assert_fail("dec.width <= numbers_internal::kFastToBufferSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                ,0x31,"absl::AlphaNum::AlphaNum(Dec)");
}

Assistant:

AlphaNum::AlphaNum(Dec dec) {
  assert(dec.width <= numbers_internal::kFastToBufferSize);
  char* const end = &digits_[numbers_internal::kFastToBufferSize];
  char* const minfill = end - dec.width;
  char* writer = end;
  uint64_t value = dec.value;
  bool neg = dec.neg;
  while (value > 9) {
    *--writer = '0' + (value % 10);
    value /= 10;
  }
  *--writer = '0' + value;
  if (neg) *--writer = '-';

  ptrdiff_t fillers = writer - minfill;
  if (fillers > 0) {
    // Tricky: if the fill character is ' ', then it's <fill><+/-><digits>
    // But...: if the fill character is '0', then it's <+/-><fill><digits>
    bool add_sign_again = false;
    if (neg && dec.fill == '0') {  // If filling with '0',
      ++writer;                    // ignore the sign we just added
      add_sign_again = true;       // and re-add the sign later.
    }
    writer -= fillers;
    std::fill_n(writer, fillers, dec.fill);
    if (add_sign_again) *--writer = '-';
  }

  piece_ = absl::string_view(writer, end - writer);
}